

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_>::get
          (AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_> *this,
          ExceptionOrValue *output)

{
  bool bVar1;
  ExceptionOr<kj::_::Void> *pEVar2;
  ExceptionOr<kj::_::Void> *this_00;
  ExceptionOrValue *output_local;
  AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_> *this_local;
  
  bVar1 = isWaiting(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    inlineRequireFailure
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-inl.h"
               ,0x30f,"!isWaiting()","",(char *)0x0);
  }
  pEVar2 = mv<kj::_::ExceptionOr<kj::_::Void>>(&this->result);
  this_00 = ExceptionOrValue::as<kj::_::Void>(output);
  ExceptionOr<kj::_::Void>::operator=(this_00,pEVar2);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    KJ_IREQUIRE(!isWaiting());
    output.as<T>() = kj::mv(result);
  }